

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNewFixed
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayNewFixed *curr)

{
  bool bVar1;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Expression **childp;
  Expression **expr;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  HeapType local_30 [2];
  Type local_20;
  Type type;
  ArrayNewFixed *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  type.id = (uintptr_t)curr;
  wasm::Type::getHeapType
            (&(curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type);
  HeapType::getArray(local_30);
  local_20.id = local_30[0].id;
  this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(type.id + 0x10)
  ;
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin(this_00);
  _expr = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end(this_00);
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
            operator!=((Iterator *)&__end2.index,(Iterator *)&expr);
    if (!bVar1) break;
    childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
             operator*((Iterator *)&__end2.index);
    note(this,childp,local_20);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  return;
}

Assistant:

void visitArrayNewFixed(ArrayNewFixed* curr) {
    auto type = curr->type.getHeapType().getArray().element.type;
    for (auto& expr : curr->values) {
      note(&expr, type);
    }
  }